

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
pbrt::ReadFloatFile(vector<float,_std::allocator<float>_> *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  pbrt *this;
  float *ptr;
  uint uVar3;
  _Vector_base<float,_std::allocator<float>_> *p_Var4;
  string_view str;
  int lineNumber;
  int c;
  int va;
  unsigned_long vb;
  _Vector_base<float,_std::allocator<float>_> local_78;
  char curNumber [32];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"r");
  if (__stream == (FILE *)0x0) {
    Error<std::__cxx11::string_const&>("%s: unable to open file",filename);
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  lineNumber = 1;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_004639ce:
  bVar1 = false;
  uVar3 = 0;
  do {
    while( true ) {
      c = getc(__stream);
      if (c == 10) {
        lineNumber = lineNumber + 1;
      }
      else if (c == -1) {
        fclose(__stream);
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = local_78._M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = local_78._M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_78._M_impl.super__Vector_impl_data._M_end_of_storage;
        p_Var4 = &local_78;
        goto LAB_00463b3b;
      }
      ptr = (float *)(long)(int)uVar3;
      if (bVar1) break;
      if (c - 0x30U < 10) goto LAB_00463a95;
      if (c == 0x23) {
        do {
          c = getc(__stream);
          if (c == 10) break;
        } while (c != -1);
        lineNumber = lineNumber + 1;
        bVar1 = false;
      }
      else {
        if ((c - 0x2dU < 2) || (c == 0x2b)) goto LAB_00463a95;
        iVar2 = isspace(c);
        bVar1 = false;
        if (iVar2 == 0) {
          Error<std::__cxx11::string_const&,int&,int&>
                    ("%s: unexpected character \"%c\" found at line %d.",filename,&c,&lineNumber);
          p_Var4 = &__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>;
LAB_00463b3b:
          (p_Var4->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (p_Var4->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
          (p_Var4->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_78);
          return __return_storage_ptr__;
        }
      }
    }
    if (0x1f < (int)uVar3) {
      LogFatal<std::__cxx11::string_const&,int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file.cpp"
                 ,0x80,"Overflowed buffer for parsing number in file: %s at line %d",filename,
                 &lineNumber);
    }
    if ((9 < c - 0x30U) &&
       ((0x3a < c - 0x2bU || ((0x40000000400000dU >> ((ulong)(c - 0x2bU) & 0x3f) & 1) == 0))))
    break;
    vb = 0x20;
    va = uVar3;
    if (0x1f < uVar3) {
      LogFatal<char_const(&)[13],char_const(&)[18],char_const(&)[13],int&,char_const(&)[18],unsigned_long&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/file.cpp"
                 ,0x85,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [13])"curNumberPos",
                 (char (*) [18])"sizeof(curNumber)",(char (*) [13])"curNumberPos",&va,
                 (char (*) [18])"sizeof(curNumber)",&vb);
    }
    ptr = (float *)(ulong)uVar3;
LAB_00463a95:
    uVar3 = uVar3 + 1;
    curNumber[(long)ptr] = (char)c;
    bVar1 = true;
  } while( true );
  curNumber[(long)ptr] = '\0';
  this = (pbrt *)strlen(curNumber);
  str._M_str = (char *)&vb;
  str._M_len = (size_t)curNumber;
  bVar1 = Atof(this,str,ptr);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&,char(&)[32]>
              ("%s: unable to parse float value \"%s\"",filename,&curNumber);
  }
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)&local_78,(value_type_conflict1 *)&vb);
  goto LAB_004639ce;
}

Assistant:

std::vector<float> ReadFloatFile(const std::string &filename) {
    FILE *f = fopen(filename.c_str(), "r");
    if (f == nullptr) {
        Error("%s: unable to open file", filename);
        return {};
    }

    int c;
    bool inNumber = false;
    char curNumber[32];
    int curNumberPos = 0;
    int lineNumber = 1;
    std::vector<float> values;
    while ((c = getc(f)) != EOF) {
        if (c == '\n')
            ++lineNumber;
        if (inNumber) {
            if (curNumberPos >= (int)sizeof(curNumber))
                LOG_FATAL("Overflowed buffer for parsing number in file: %s at "
                          "line %d",
                          filename, lineNumber);
            // Note: this is not very robust, and would accept something
            // like 0.0.0.0eeee-+--2 as a valid number.
            if ((isdigit(c) != 0) || c == '.' || c == 'e' || c == 'E' || c == '-' ||
                c == '+') {
                CHECK_LT(curNumberPos, sizeof(curNumber));
                curNumber[curNumberPos++] = c;
            } else {
                curNumber[curNumberPos++] = '\0';
                float v;
                if (!Atof(curNumber, &v))
                    ErrorExit("%s: unable to parse float value \"%s\"", filename,
                              curNumber);
                values.push_back(v);
                inNumber = false;
                curNumberPos = 0;
            }
        } else {
            if ((isdigit(c) != 0) || c == '.' || c == '-' || c == '+') {
                inNumber = true;
                curNumber[curNumberPos++] = c;
            } else if (c == '#') {
                while ((c = getc(f)) != '\n' && c != EOF)
                    ;
                ++lineNumber;
            } else if (isspace(c) == 0) {
                Error("%s: unexpected character \"%c\" found at line %d.", filename, c,
                      lineNumber);
                return {};
            }
        }
    }
    fclose(f);
    return values;
}